

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_suite.cpp
# Opt level: O2

void number_suite::test_int64(void)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  writer writer;
  size_type local_a0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  undefined4 local_7c;
  basic_writer<16UL> local_78;
  
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trial::protocol::bintoken::basic_writer<16ul>::
  basic_writer<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((basic_writer<16ul> *)&local_78,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98);
  local_a0 = trial::protocol::bintoken::basic_writer<16UL>::overloader<long,_void>::value
                       (&local_78,0x100000000000000);
  local_7c = 9;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.value(INT64_C(0x100000000000000))","9",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xbc,"void number_suite::test_int64()",&local_a0,&local_7c);
  local_a0 = (long)local_98._M_impl.super__Vector_impl_data._M_finish -
             (long)local_98._M_impl.super__Vector_impl_data._M_start;
  local_7c = 9;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("result.size()","9",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xbd,"void number_suite::test_int64()",&local_a0,&local_7c);
  local_a0._0_4_ = 0xd6;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,unsigned_char,trial::protocol::bintoken::token::code::value>
            ("result[0]","token::code::int64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xbe,"void number_suite::test_int64()",
             local_98._M_impl.super__Vector_impl_data._M_start,&local_a0);
  local_a0._0_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[1]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xbf,"void number_suite::test_int64()",
             local_98._M_impl.super__Vector_impl_data._M_start + 1,&local_a0);
  local_a0._0_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[2]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xc0,"void number_suite::test_int64()",
             local_98._M_impl.super__Vector_impl_data._M_start + 2,&local_a0);
  local_a0._0_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[3]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xc1,"void number_suite::test_int64()",
             local_98._M_impl.super__Vector_impl_data._M_start + 3,&local_a0);
  local_a0._0_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[4]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xc2,"void number_suite::test_int64()",
             local_98._M_impl.super__Vector_impl_data._M_start + 4,&local_a0);
  local_a0._0_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[5]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xc3,"void number_suite::test_int64()",
             local_98._M_impl.super__Vector_impl_data._M_start + 5,&local_a0);
  local_a0._0_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[6]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xc4,"void number_suite::test_int64()",
             local_98._M_impl.super__Vector_impl_data._M_start + 6,&local_a0);
  local_a0._0_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[7]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xc5,"void number_suite::test_int64()",
             local_98._M_impl.super__Vector_impl_data._M_start + 7,&local_a0);
  local_a0 = CONCAT44(local_a0._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[8]","0x01",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xc6,"void number_suite::test_int64()",
             local_98._M_impl.super__Vector_impl_data._M_start + 8,&local_a0);
  trial::protocol::bintoken::basic_writer<16UL>::~basic_writer(&local_78);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_98);
  return;
}

Assistant:

void test_uint8()
{
    std::vector<output_type> result;
    format::writer writer(result);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0x00)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0x7F)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0xD0)), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0xFF)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result.size(), 5);
    TRIAL_PROTOCOL_TEST_EQUAL(result[0], 0x00);
    TRIAL_PROTOCOL_TEST_EQUAL(result[1], 0x7F);
    TRIAL_PROTOCOL_TEST_EQUAL(result[2], token::code::int8);
    TRIAL_PROTOCOL_TEST_EQUAL(result[3], 0xD0);
    TRIAL_PROTOCOL_TEST_EQUAL(result[4], 0xFF);
}